

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sw_blocked_sse41_128_16.c
# Opt level: O2

parasail_result_t *
parasail_sw_table_blocked_sse41_128_16
          (char *s1,int s1Len,char *s2,int s2Len,int open,int gap,parasail_matrix_t *matrix)

{
  int *piVar1;
  undefined2 uVar2;
  int iVar3;
  __m128i *ptr;
  __m128i *ptr_00;
  __m128i *ptr_01;
  parasail_result_t *ppVar4;
  ulong uVar5;
  ulong uVar6;
  int iVar7;
  ulong uVar8;
  size_t size;
  long lVar9;
  ulong uVar10;
  __m128i *palVar11;
  char *pcVar12;
  long lVar13;
  long lVar14;
  bool bVar15;
  __m128i extraout_XMM0;
  __m128i alVar16;
  undefined1 auVar17 [16];
  __m128i_16_t in_XMM1;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  short sVar20;
  short sVar21;
  short sVar22;
  short sVar23;
  short sVar24;
  short sVar25;
  short sVar26;
  short sVar27;
  short sVar28;
  short sVar29;
  short sVar30;
  short sVar31;
  ushort uVar32;
  ushort uVar34;
  ushort uVar35;
  ushort uVar36;
  ushort uVar37;
  ushort uVar38;
  ushort uVar39;
  undefined1 auVar33 [16];
  ushort uVar40;
  ushort uVar41;
  short sVar42;
  short sVar43;
  short sVar46;
  short sVar47;
  short sVar48;
  short sVar49;
  short sVar50;
  short sVar51;
  short sVar52;
  short sVar53;
  short sVar54;
  short sVar55;
  short sVar56;
  short sVar57;
  short sVar58;
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  short sVar59;
  undefined1 auVar60 [16];
  int local_a0;
  __m128i_16_t t;
  ulong local_88;
  char *local_80;
  size_t local_78;
  char *local_70;
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  __m128i_16_t e;
  
  uVar6 = (long)(s1Len + 7) / 8;
  iVar7 = (int)uVar6;
  local_80 = s1;
  local_70 = s2;
  ptr = parasail_memalign___m128i(0x10,(long)(iVar7 * 0x18));
  size = (size_t)iVar7;
  ptr_00 = parasail_memalign___m128i(0x10,size);
  ptr_01 = parasail_memalign___m128i(0x10,size);
  local_68 = ZEXT416((uint)open);
  local_58 = ZEXT416((uint)gap);
  local_88 = (ulong)(uint)s2Len;
  ppVar4 = parasail_result_new_table1(iVar7 * 8,s2Len);
  uVar5 = 0;
  if (0 < iVar7) {
    uVar5 = uVar6 & 0xffffffff;
  }
  alVar16 = extraout_XMM0;
  iVar7 = 0;
  for (iVar3 = 0; local_a0 = (int)uVar5, iVar3 != 0x18; iVar3 = iVar3 + 1) {
    lVar13 = 0;
    pcVar12 = local_80;
    for (lVar9 = (long)iVar7; lVar9 != local_a0 + iVar7; lVar9 = lVar9 + 1) {
      for (lVar14 = 0; lVar14 != 8; lVar14 = lVar14 + 1) {
        if (lVar13 + lVar14 < (long)s1Len) {
          uVar2 = (undefined2)
                  matrix->matrix[(long)matrix->mapper[(byte)pcVar12[lVar14]] * (long)matrix->size];
        }
        else {
          uVar2 = 0;
        }
        *(undefined2 *)((long)&t + lVar14 * 2) = uVar2;
      }
      alVar16[1] = t.m[1];
      alVar16[0] = t.m[0];
      ptr[lVar9] = alVar16;
      lVar13 = lVar13 + 8;
      pcVar12 = pcVar12 + 8;
    }
    iVar7 = local_a0 + iVar7;
  }
  auVar17 = pshuflw((undefined1  [16])alVar16,local_68,0);
  for (uVar6 = 0; uVar6 != uVar5; uVar6 = uVar6 + 1) {
    for (lVar9 = 0; lVar9 != 8; lVar9 = lVar9 + 1) {
      *(undefined2 *)((long)&t + lVar9 * 2) = 0;
      *(short *)((long)&e + lVar9 * 2) = -(short)open;
    }
    ptr_00[uVar6][0] = t.m[0];
    ptr_00[uVar6][1] = t.m[1];
    *(__m128i_16_t *)(ptr_01 + uVar6) = e;
    in_XMM1 = e;
  }
  auVar18 = pshuflw((undefined1  [16])in_XMM1,local_58,0);
  lVar9 = (long)(int)local_88;
  uVar8 = 0;
  uVar6 = local_88 & 0xffffffff;
  if ((int)local_88 < 1) {
    uVar6 = uVar8;
  }
  sVar20 = auVar18._0_2_;
  sVar22 = auVar17._0_2_;
  sVar21 = auVar18._2_2_;
  sVar23 = auVar17._2_2_;
  auVar17 = (undefined1  [16])0x0;
  for (; uVar8 != uVar6; uVar8 = uVar8 + 1) {
    iVar7 = matrix->mapper[(byte)local_70[uVar8]];
    auVar18 = (undefined1  [16])0x0;
    uVar41 = 0xc000;
    for (uVar10 = 0; uVar10 != uVar5; uVar10 = uVar10 + 1) {
      alVar16 = ptr_00[uVar10];
      palVar11 = ptr_01 + uVar10;
      sVar24 = (short)(*palVar11)[0];
      sVar25 = *(short *)((long)*palVar11 + 2);
      sVar26 = *(short *)((long)*palVar11 + 4);
      sVar27 = *(short *)((long)*palVar11 + 6);
      sVar28 = (short)(*palVar11)[1];
      sVar29 = *(short *)((long)*palVar11 + 10);
      sVar30 = *(short *)((long)*palVar11 + 0xc);
      sVar31 = *(short *)((long)*palVar11 + 0xe);
      auVar33._0_8_ = alVar16[0] << 0x10;
      auVar33._8_8_ = alVar16[1] << 0x10 | alVar16[0] >> 0x30;
      auVar18 = auVar18 | auVar33;
      palVar11 = ptr + (long)iVar7 * size + uVar10;
      sVar42 = auVar18._0_2_ + (short)(*palVar11)[0];
      sVar46 = auVar18._2_2_ + *(short *)((long)*palVar11 + 2);
      sVar48 = auVar18._4_2_ + *(short *)((long)*palVar11 + 4);
      sVar50 = auVar18._6_2_ + *(short *)((long)*palVar11 + 6);
      sVar52 = auVar18._8_2_ + (short)(*palVar11)[1];
      sVar54 = auVar18._10_2_ + *(short *)((long)*palVar11 + 10);
      sVar56 = auVar18._12_2_ + *(short *)((long)*palVar11 + 0xc);
      sVar58 = auVar18._14_2_ + *(short *)((long)*palVar11 + 0xe);
      sVar47 = (ushort)(-1 < sVar24) * sVar24;
      sVar43 = (ushort)(-1 < sVar25) * sVar25;
      sVar59 = (ushort)(-1 < sVar26) * sVar26;
      sVar57 = (ushort)(-1 < sVar27) * sVar27;
      sVar55 = (ushort)(-1 < sVar28) * sVar28;
      sVar53 = (ushort)(-1 < sVar29) * sVar29;
      sVar51 = (ushort)(-1 < sVar30) * sVar30;
      sVar49 = (ushort)(-1 < sVar31) * sVar31;
      uVar32 = (ushort)(sVar47 < sVar42) * sVar42 | (ushort)(sVar47 >= sVar42) * sVar47;
      uVar34 = (ushort)(sVar43 < sVar46) * sVar46 | (ushort)(sVar43 >= sVar46) * sVar43;
      uVar35 = (ushort)(sVar59 < sVar48) * sVar48 | (ushort)(sVar59 >= sVar48) * sVar59;
      uVar36 = (ushort)(sVar57 < sVar50) * sVar50 | (ushort)(sVar57 >= sVar50) * sVar57;
      uVar37 = (ushort)(sVar55 < sVar52) * sVar52 | (ushort)(sVar55 >= sVar52) * sVar55;
      uVar38 = (ushort)(sVar53 < sVar54) * sVar54 | (ushort)(sVar53 >= sVar54) * sVar53;
      uVar39 = (ushort)(sVar51 < sVar56) * sVar56 | (ushort)(sVar51 >= sVar56) * sVar51;
      uVar40 = (ushort)(sVar49 < sVar58) * sVar58 | (ushort)(sVar49 >= sVar58) * sVar49;
      auVar45._0_2_ = uVar41 - sVar22;
      auVar45._2_2_ = uVar32 - sVar23;
      auVar45._4_2_ = uVar34 - sVar22;
      auVar45._6_2_ = uVar35 - sVar23;
      auVar45._8_2_ = uVar36 - sVar22;
      auVar45._10_2_ = uVar37 - sVar23;
      auVar45._12_2_ = uVar38 - sVar22;
      auVar45._14_2_ = uVar39 - sVar23;
      auVar44._0_2_ = -(ushort)(0 < auVar45._0_2_);
      auVar44._2_2_ = -(ushort)(0 < auVar45._2_2_);
      auVar44._4_2_ = -(ushort)(0 < auVar45._4_2_);
      auVar44._6_2_ = -(ushort)(0 < auVar45._6_2_);
      auVar44._8_2_ = -(ushort)(0 < auVar45._8_2_);
      auVar44._10_2_ = -(ushort)(0 < auVar45._10_2_);
      auVar44._12_2_ = -(ushort)(0 < auVar45._12_2_);
      auVar44._14_2_ = -(ushort)(0 < auVar45._14_2_);
      auVar18 = auVar45;
      uVar41 = uVar40;
      if ((((((((((((((((auVar44 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                       (auVar44 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar44 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar44 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar44 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar44 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar44 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                 (auVar44 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar44 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
               (auVar44 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar44 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
             (auVar44 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar44 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
           (auVar44 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          (auVar44._14_2_ >> 7 & 1) != 0) || (auVar44._14_2_ & 0x8000) != 0) {
        while( true ) {
          auVar60._0_2_ = -(ushort)(0 < auVar45._0_2_);
          sVar42 = auVar45._2_2_;
          auVar60._2_2_ = -(ushort)(0 < sVar42);
          sVar46 = auVar45._4_2_;
          auVar60._4_2_ = -(ushort)(0 < sVar46);
          sVar48 = auVar45._6_2_;
          auVar60._6_2_ = -(ushort)(0 < sVar48);
          sVar50 = auVar45._8_2_;
          auVar60._8_2_ = -(ushort)(0 < sVar50);
          sVar52 = auVar45._10_2_;
          auVar60._10_2_ = -(ushort)(0 < sVar52);
          sVar54 = auVar45._12_2_;
          auVar60._12_2_ = -(ushort)(0 < sVar54);
          auVar60._14_2_ = -(ushort)(0 < auVar45._14_2_);
          sVar43 = auVar18._0_2_;
          sVar47 = auVar18._2_2_;
          sVar49 = auVar18._4_2_;
          sVar51 = auVar18._6_2_;
          sVar53 = auVar18._8_2_;
          sVar55 = auVar18._10_2_;
          sVar57 = auVar18._12_2_;
          sVar59 = auVar18._14_2_;
          if ((((((((((((((((auVar60 >> 7 & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                           (auVar60 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                          (auVar60 >> 0x17 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                         (auVar60 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                        (auVar60 >> 0x27 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                       (auVar60 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                      (auVar60 >> 0x37 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                     (auVar60 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                    (auVar60 >> 0x47 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                   (auVar60 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (auVar60 >> 0x57 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                 (auVar60 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                (auVar60 >> 0x67 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
               (auVar60 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              (auVar60._14_2_ >> 7 & 1) == 0) && (auVar60._14_2_ & 0x8000) == 0) break;
          sVar56 = -sVar20;
          auVar45._2_2_ = auVar45._0_2_ - sVar21;
          auVar45._0_2_ = sVar56;
          auVar45._4_2_ = sVar42 - sVar20;
          auVar45._6_2_ = sVar46 - sVar21;
          auVar45._8_2_ = sVar48 - sVar20;
          auVar45._10_2_ = sVar50 - sVar21;
          auVar45._12_2_ = sVar52 - sVar20;
          auVar45._14_2_ = sVar54 - sVar21;
          auVar18._0_2_ = (ushort)(sVar43 < sVar56) * sVar56 | (ushort)(sVar43 >= sVar56) * sVar43;
          auVar18._2_2_ =
               (ushort)(sVar47 < auVar45._2_2_) * auVar45._2_2_ |
               (ushort)(sVar47 >= auVar45._2_2_) * sVar47;
          auVar18._4_2_ =
               (ushort)(sVar49 < auVar45._4_2_) * auVar45._4_2_ |
               (ushort)(sVar49 >= auVar45._4_2_) * sVar49;
          auVar18._6_2_ =
               (ushort)(sVar51 < auVar45._6_2_) * auVar45._6_2_ |
               (ushort)(sVar51 >= auVar45._6_2_) * sVar51;
          auVar18._8_2_ =
               (ushort)(sVar53 < auVar45._8_2_) * auVar45._8_2_ |
               (ushort)(sVar53 >= auVar45._8_2_) * sVar53;
          auVar18._10_2_ =
               (ushort)(sVar55 < auVar45._10_2_) * auVar45._10_2_ |
               (ushort)(sVar55 >= auVar45._10_2_) * sVar55;
          auVar18._12_2_ =
               (ushort)(sVar57 < auVar45._12_2_) * auVar45._12_2_ |
               (ushort)(sVar57 >= auVar45._12_2_) * sVar57;
          auVar18._14_2_ =
               (ushort)(sVar59 < auVar45._14_2_) * auVar45._14_2_ |
               (ushort)(sVar59 >= auVar45._14_2_) * sVar59;
        }
        uVar32 = (ushort)((short)uVar32 < sVar43) * sVar43 | ((short)uVar32 >= sVar43) * uVar32;
        uVar34 = (ushort)((short)uVar34 < sVar47) * sVar47 | ((short)uVar34 >= sVar47) * uVar34;
        uVar35 = (ushort)((short)uVar35 < sVar49) * sVar49 | ((short)uVar35 >= sVar49) * uVar35;
        uVar36 = (ushort)((short)uVar36 < sVar51) * sVar51 | ((short)uVar36 >= sVar51) * uVar36;
        uVar37 = (ushort)((short)uVar37 < sVar53) * sVar53 | ((short)uVar37 >= sVar53) * uVar37;
        uVar38 = (ushort)((short)uVar38 < sVar55) * sVar55 | ((short)uVar38 >= sVar55) * uVar38;
        uVar39 = (ushort)((short)uVar39 < sVar57) * sVar57 | ((short)uVar39 >= sVar57) * uVar39;
        uVar40 = (ushort)((short)uVar40 < sVar59) * sVar59 | ((short)uVar40 >= sVar59) * uVar40;
        sVar59 = sVar59 + (sVar23 - sVar21);
        uVar41 = (sVar59 < (short)uVar40) * uVar40 | (ushort)(sVar59 >= (short)uVar40) * sVar59;
      }
      palVar11 = ptr_00 + uVar10;
      *(ushort *)*palVar11 = uVar32;
      *(ushort *)((long)*palVar11 + 2) = uVar34;
      *(ushort *)((long)*palVar11 + 4) = uVar35;
      *(ushort *)((long)*palVar11 + 6) = uVar36;
      *(ushort *)(*palVar11 + 1) = uVar37;
      *(ushort *)((long)*palVar11 + 10) = uVar38;
      *(ushort *)((long)*palVar11 + 0xc) = uVar39;
      *(ushort *)((long)*palVar11 + 0xe) = uVar40;
      piVar1 = ((ppVar4->field_4).rowcols)->score_row;
      piVar1[uVar10 * 8 * lVar9 + uVar8] = (int)(short)uVar32;
      piVar1[(uVar10 * 8 + 1) * lVar9 + uVar8] = (int)(short)uVar34;
      piVar1[(uVar10 * 8 + 2) * lVar9 + uVar8] = (int)(short)uVar35;
      piVar1[(uVar10 * 8 + 3) * lVar9 + uVar8] = (int)(short)uVar36;
      palVar11 = ptr_01 + uVar10;
      piVar1[(uVar10 * 8 + 4) * lVar9 + uVar8] = (int)(short)uVar37;
      auVar18 = (undefined1  [16])alVar16 >> 0x70;
      piVar1[(uVar10 * 8 + 5) * lVar9 + uVar8] = (int)(short)uVar38;
      piVar1[(uVar10 * 8 + 6) * lVar9 + uVar8] = (int)(short)uVar39;
      piVar1[(uVar10 * 8 + 7) * lVar9 + uVar8] = (int)(short)uVar40;
      sVar43 = auVar17._0_2_;
      auVar19._0_2_ = (sVar43 < (short)uVar32) * uVar32 | (ushort)(sVar43 >= (short)uVar32) * sVar43
      ;
      sVar43 = auVar17._2_2_;
      auVar19._2_2_ = (sVar43 < (short)uVar34) * uVar34 | (ushort)(sVar43 >= (short)uVar34) * sVar43
      ;
      sVar43 = auVar17._4_2_;
      auVar19._4_2_ = (sVar43 < (short)uVar35) * uVar35 | (ushort)(sVar43 >= (short)uVar35) * sVar43
      ;
      sVar43 = auVar17._6_2_;
      auVar19._6_2_ = (sVar43 < (short)uVar36) * uVar36 | (ushort)(sVar43 >= (short)uVar36) * sVar43
      ;
      sVar43 = auVar17._8_2_;
      auVar19._8_2_ = (sVar43 < (short)uVar37) * uVar37 | (ushort)(sVar43 >= (short)uVar37) * sVar43
      ;
      sVar43 = auVar17._10_2_;
      auVar19._10_2_ =
           (sVar43 < (short)uVar38) * uVar38 | (ushort)(sVar43 >= (short)uVar38) * sVar43;
      sVar43 = auVar17._12_2_;
      sVar47 = auVar17._14_2_;
      auVar19._12_2_ =
           (sVar43 < (short)uVar39) * uVar39 | (ushort)(sVar43 >= (short)uVar39) * sVar43;
      auVar19._14_2_ =
           (sVar47 < (short)uVar40) * uVar40 | (ushort)(sVar47 >= (short)uVar40) * sVar47;
      sVar43 = uVar32 - sVar22;
      sVar47 = uVar34 - sVar23;
      sVar49 = uVar35 - sVar22;
      sVar51 = uVar36 - sVar23;
      sVar53 = uVar37 - sVar22;
      sVar55 = uVar38 - sVar23;
      sVar57 = uVar39 - sVar22;
      sVar59 = uVar40 - sVar23;
      sVar24 = sVar24 - sVar20;
      sVar25 = sVar25 - sVar21;
      sVar26 = sVar26 - sVar20;
      sVar27 = sVar27 - sVar21;
      sVar28 = sVar28 - sVar20;
      sVar29 = sVar29 - sVar21;
      sVar30 = sVar30 - sVar20;
      sVar31 = sVar31 - sVar21;
      *(ushort *)*palVar11 =
           (ushort)(sVar24 < sVar43) * sVar43 | (ushort)(sVar24 >= sVar43) * sVar24;
      *(ushort *)((long)*palVar11 + 2) =
           (ushort)(sVar25 < sVar47) * sVar47 | (ushort)(sVar25 >= sVar47) * sVar25;
      *(ushort *)((long)*palVar11 + 4) =
           (ushort)(sVar26 < sVar49) * sVar49 | (ushort)(sVar26 >= sVar49) * sVar26;
      *(ushort *)((long)*palVar11 + 6) =
           (ushort)(sVar27 < sVar51) * sVar51 | (ushort)(sVar27 >= sVar51) * sVar27;
      *(ushort *)(*palVar11 + 1) =
           (ushort)(sVar28 < sVar53) * sVar53 | (ushort)(sVar28 >= sVar53) * sVar28;
      *(ushort *)((long)*palVar11 + 10) =
           (ushort)(sVar29 < sVar55) * sVar55 | (ushort)(sVar29 >= sVar55) * sVar29;
      *(ushort *)((long)*palVar11 + 0xc) =
           (ushort)(sVar30 < sVar57) * sVar57 | (ushort)(sVar30 >= sVar57) * sVar30;
      *(ushort *)((long)*palVar11 + 0xe) =
           (ushort)(sVar31 < sVar59) * sVar59 | (ushort)(sVar31 >= sVar59) * sVar31;
      auVar17 = auVar19;
    }
  }
  iVar3 = -0x4000;
  iVar7 = 8;
  while (bVar15 = iVar7 != 0, iVar7 = iVar7 + -1, bVar15) {
    uVar6 = auVar17._0_8_;
    lVar9 = auVar17._8_8_;
    if (iVar3 <= auVar17._14_2_) {
      iVar3 = (int)auVar17._14_2_;
    }
    auVar17._0_8_ = uVar6 << 0x10;
    auVar17._8_8_ = lVar9 << 0x10 | uVar6 >> 0x30;
  }
  ppVar4->score = iVar3;
  ppVar4->flag = ppVar4->flag | 0x8222004;
  local_78 = size;
  parasail_free(ptr_01);
  parasail_free(ptr_00);
  parasail_free(ptr);
  return ppVar4;
}

Assistant:

parasail_result_t* FNAME(
        const char * const restrict s1, const int s1Len,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap, const parasail_matrix_t *matrix)
{
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int32_t segNum = 0;
    const int32_t n = 24; /* number of amino acids in table */
    const int32_t segWidth = 8; /* number of values in vector unit */
    const int32_t segLen = (s1Len + segWidth - 1) / segWidth;
    __m128i* const restrict vProfile = parasail_memalign___m128i(16, n * segLen);
    __m128i* restrict pvH = parasail_memalign___m128i(16, segLen);
    __m128i* const restrict pvE = parasail_memalign___m128i(16, segLen);
    int score = NEG_INF_16;
    __m128i vGapO = _mm_set1_epi16(open);
    __m128i vGapE = _mm_set1_epi16(gap);
    __m128i vZero = _mm_setzero_si128();
    __m128i vNegInf = _mm_set1_epi16(NEG_INF_16);
    __m128i vMaxH = vZero;
#ifdef PARASAIL_TABLE
    parasail_result_t *result = parasail_result_new_table1(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    parasail_result_t *result = parasail_result_new_rowcol1(segLen*segWidth, s2Len);
    const int32_t offset = segLen - 1;
    const int32_t position = s1Len % segWidth;
#else
    parasail_result_t *result = parasail_result_new();
#endif
#endif

    /* Generate query profile.
     * Rearrange query sequence & calculate the weight of match/mismatch.
     * Don't alias. */
    {
        int32_t index = 0;
        for (k=0; k<n; ++k) {
            for (i=0; i<segLen; ++i) {
                __m128i_16_t t;
                j = i*segWidth;
                for (segNum=0; segNum<segWidth; ++segNum) {
                    t.v[segNum] = j >= s1Len ? 0 : matrix->matrix[matrix->size*matrix->mapper[(unsigned char)s1[j]]];
                    j += 1;
                }
                _mm_store_si128(&vProfile[index], t.m);
                ++index;
            }
        }
    }

    /* initialize H and E */
    {
        int32_t index = 0;
        for (i=0; i<segLen; ++i) {
            __m128i_16_t h;
            __m128i_16_t e;
            for (segNum=0; segNum<segWidth; ++segNum) {
                h.v[segNum] = 0;
                e.v[segNum] = -open;
            }
            _mm_store_si128(&pvH[index], h.m);
            _mm_store_si128(&pvE[index], e.m);
            ++index;
        }
    }

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m128i vX = vZero;
        __m128i vF = vNegInf;
        const __m128i* pvP = vProfile + matrix->mapper[(unsigned char)s2[j]] * segLen;
        for (i=0; i<segLen; ++i) {
            __m128i vP;
            __m128i vH;
            __m128i vE;
            __m128i vT1;

            vH = _mm_load_si128(pvH + i);
            vE = _mm_load_si128(pvE + i);

            vT1 = _mm_srli_si128(vH, 14); /* rshift 3 */
            vH = _mm_slli_si128(vH, 2); /* lshift 1 */
            vH = _mm_or_si128(vH, vX);
            vX = vT1;

            vP = _mm_load_si128(pvP + i);
            vH = _mm_add_epi16(vH, vP);
            vH = _mm_max_epi16(vH, vE);
            vH = _mm_max_epi16(vH, vZero);

            vF = _mm_srli_si128(vF, 14);
            vF = _mm_or_si128(vF, _mm_slli_si128(vH, 2));
            vF = _mm_sub_epi16(vF, vGapO);
            if (_mm_movemask_epi8(_mm_cmpgt_epi16(vF, vZero))) {
                __m128i vT2 = vF;
                while (_mm_movemask_epi8(_mm_cmpgt_epi16(vT2, vZero))) {
                    vT2 = _mm_slli_si128(vT2, 2);
                    vT2 = _mm_sub_epi16(vT2, vGapE);
                    vF = _mm_max_epi16(vF, vT2);
                }
                vH = _mm_max_epi16(vH, vF);
                vF = _mm_add_epi16(vF, vGapO);
                vF = _mm_sub_epi16(vF, vGapE);
                vF = _mm_max_epi16(vH, vF);
            }
            else {
                vF = vH;
            }

            _mm_store_si128(pvH + i, vH);
#ifdef PARASAIL_TABLE
            arr_store_si128(result->tables->score_table, vH, i, segWidth, j, s2Len);
#endif
            vMaxH = _mm_max_epi16(vMaxH, vH);

            vH = _mm_sub_epi16(vH, vGapO);
            vE = _mm_sub_epi16(vE, vGapE);
            vE = _mm_max_epi16(vE, vH);
            _mm_store_si128(pvE + i, vE);

        }

#ifdef PARASAIL_ROWCOL
        /* extract last value from the column */
        {
            __m128i vH = _mm_load_si128(pvH + offset);
            for (k=0; k<position; ++k) {
                vH = _mm_slli_si128(vH, 2);
            }
            result->rowcols->score_row[j] = (int16_t) _mm_extract_epi16 (vH, 7);
        }
#endif
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m128i vH = _mm_load_si128(pvH + i);
        arr_store_col(result->rowcols->score_col, vH, i, segWidth);
    }
#endif

    /* max in vec */
    for (j=0; j<segWidth; ++j) {
        int16_t value = (int16_t) _mm_extract_epi16(vMaxH, 7);
        if (value > score) {
            score = value;
        }
        vMaxH = _mm_slli_si128(vMaxH, 2);
    }

    result->score = score;
    result->flag |= PARASAIL_FLAG_SW | PARASAIL_FLAG_BLOCKED
        | PARASAIL_FLAG_BITS_16 | PARASAIL_FLAG_LANES_8;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    parasail_free(pvE);
    parasail_free(pvH);
    parasail_free(vProfile);

    return result;
}